

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mocker::ir::Interpreter::executePhis::Change::~Change(Change *this)

{
  Change *this_local;
  
  std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&this->reg);
  return;
}

Assistant:

void Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &phis) {
  struct Change {
    Change(std::shared_ptr<Addr> reg, int64_t val)
        : reg(std::move(reg)), val(val) {}
    std::shared_ptr<Addr> reg;
    std::int64_t val;
  };
  std::vector<Change> changes;
  auto &ar = ars.top();

  for (const auto &p : phis) {
    bool found = false;
    for (auto &option : p->getOptions()) {
      if (option.second->getID() == ar.lastBB) {
        auto val = readVal(option.first);
        changes.emplace_back(p->getDest(), (std::int64_t)val);
        found = true;
        break;
      }
    }
    assert(found);
  }

  for (const auto &change : changes) {
    writeReg(change.reg, change.val);
  }
}